

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall
AppParametersTest_duplicate_switch_Test::~AppParametersTest_duplicate_switch_Test
          (AppParametersTest_duplicate_switch_Test *this)

{
  AppParametersTest_duplicate_switch_Test *this_local;
  
  ~AppParametersTest_duplicate_switch_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AppParametersTest, duplicate_switch) {
	ArgWrapper args{ "/path/to/exe", "-switch", "--switch" };
	app_parameters parameters{ args.argc(), args.argv() };

	EXPECT_FALSE(parameters.name().empty());
	EXPECT_EQ(parameters.arguments().size(), 2U);
	EXPECT_EQ(parameters.switches().size(), 2U);
	EXPECT_EQ(parameters.switches_set().size(), 1U);
	EXPECT_TRUE(parameters.values().empty());

	auto obj = parameters.as_object();
	std::vector<std::u8string> expected_args{ u8"-switch", u8"--switch" };
	std::vector<std::u8string> expected_switches{ u8"switch", u8"switch" };
	EXPECT_FALSE(obj.null());
	EXPECT_EQ(obj[u8"Name"], u8"/path/to/exe");
	EXPECT_EQ(obj[u8"Args"], expected_args);
	EXPECT_EQ(obj[u8"Switches"], expected_switches);
}